

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu1.c
# Opt level: O0

MPP_RET hal_jpegd_vdpu1_control(void *hal,MpiCmd cmd_type,void *param)

{
  JpegdHalCtx *JpegHalCtx;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_type_local;
  void *hal_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","enter\n","hal_jpegd_vdpu1_control");
  }
  JpegHalCtx._4_4_ = MPP_OK;
  if (hal == (void *)0x0) {
    _mpp_log_l(2,"HAL_JPEGD_VDPU1","NULL pointer","hal_jpegd_vdpu1_control");
    hal_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if (cmd_type == MPP_DEC_SET_OUTPUT_FORMAT) {
      *(undefined4 *)((long)hal + 0x90) = *param;
      *(undefined4 *)((long)hal + 0x94) = 1;
      if ((jpegd_debug & 0x80) != 0) {
        _mpp_log_l(4,"HAL_JPEGD_VDPU1","output_format: 0x%x\n",(char *)0x0,
                   (ulong)*(uint *)((long)hal + 0x90));
      }
      if ((((*(uint *)((long)hal + 0x90) & 0xf0000) != 0) ||
          (0x13 < (*(uint *)((long)hal + 0x90) & 0xfffff))) &&
         (((*(uint *)((long)hal + 0x90) & 0xf0000) != 0x10000 ||
          (0x1000f < (*(uint *)((long)hal + 0x90) & 0xfffff))))) {
        _mpp_log_l(2,"HAL_JPEGD_VDPU1","invalid output format 0x%x\n","hal_jpegd_vdpu1_control",
                   (ulong)*(uint *)((long)hal + 0x90));
        JpegHalCtx._4_4_ = MPP_ERR_VALUE;
      }
    }
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"HAL_JPEGD_VDPU1","exit ret %d\n","hal_jpegd_vdpu1_control",
                 (ulong)(uint)JpegHalCtx._4_4_);
    }
    hal_local._4_4_ = JpegHalCtx._4_4_;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_jpegd_vdpu1_control(void *hal, MpiCmd cmd_type, void *param)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    if (NULL == JpegHalCtx) {
        mpp_err_f("NULL pointer");
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd_type) {
    case MPP_DEC_SET_OUTPUT_FORMAT: {
        JpegHalCtx->output_fmt = *((MppFrameFormat *)param);
        JpegHalCtx->set_output_fmt_flag = 1;
        jpegd_dbg_hal("output_format: 0x%x\n", JpegHalCtx->output_fmt);

        if (!MPP_FRAME_FMT_IS_YUV(JpegHalCtx->output_fmt) && !MPP_FRAME_FMT_IS_RGB(JpegHalCtx->output_fmt)) {
            mpp_err_f("invalid output format 0x%x\n", JpegHalCtx->output_fmt);
            ret = MPP_ERR_VALUE;
        }
    } break;
    default :
        break;
    }

    jpegd_dbg_func("exit ret %d\n", ret);
    return  ret;
}